

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcElementQuantity::~IfcElementQuantity(IfcElementQuantity *this)

{
  pointer pcVar1;
  undefined1 *puVar2;
  
  this[-1].super_IfcPropertySetDefinition.super_IfcPropertyDefinition.super_IfcRoot.Description.ptr.
  _M_string_length = 0x984e80;
  *(undefined8 *)
   ((long)&(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.Name.ptr
           .field_2 + 8) = 0x984f20;
  this[-1].Quantities.
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(vtable + 0x40);
  *(undefined8 *)&this[-1].field_0x100 = 0x984ed0;
  (this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x984ef8;
  pcVar1 = (this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.Name.ptr
           ._M_dataplus._M_p;
  if (pcVar1 != (pointer)0x0) {
    operator_delete(pcVar1);
  }
  puVar2 = *(undefined1 **)
            &(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.field_0x10;
  if (puVar2 != &(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.field_0x20) {
    operator_delete(puVar2);
  }
  this[-1].super_IfcPropertySetDefinition.super_IfcPropertyDefinition.super_IfcRoot.Description.ptr.
  _M_string_length = 0x985110;
  *(undefined8 *)
   ((long)&(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.Name.ptr
           .field_2 + 8) = 0x985138;
  if (*(undefined1 **)&this[-1].field_0xc8 != &this[-1].field_0xd8) {
    operator_delete(*(undefined1 **)&this[-1].field_0xc8);
  }
  puVar2 = *(undefined1 **)
            &this[-1].super_IfcPropertySetDefinition.super_IfcPropertyDefinition.field_0xa0;
  if (puVar2 != &this[-1].super_IfcPropertySetDefinition.field_0xb0) {
    operator_delete(puVar2);
  }
  puVar2 = *(undefined1 **)
            ((long)&this[-1].super_IfcPropertySetDefinition.super_IfcPropertyDefinition.
                    super_IfcRoot.Description.ptr.field_2 + 8);
  if (puVar2 != &this[-1].super_IfcPropertySetDefinition.super_IfcPropertyDefinition.super_IfcRoot.
                 field_0x88) {
    operator_delete(puVar2);
  }
  operator_delete(&this[-1].super_IfcPropertySetDefinition.super_IfcPropertyDefinition.super_IfcRoot
                   .Description.ptr._M_string_length);
  return;
}

Assistant:

IfcElementQuantity() : Object("IfcElementQuantity") {}